

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::OptionSectionParser::parseLine
          (OptionSectionParser *this,ForceField *param_2,string *line,int lineNo)

{
  int iVar1;
  uint in_ECX;
  StringTokenizer *in_RDX;
  string optionValue;
  string optionName;
  StringTokenizer tokenizer;
  undefined4 in_stack_fffffffffffffef0;
  string local_f0 [16];
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  StringTokenizer *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  ForceFieldOptions *in_stack_ffffffffffffff70;
  StringTokenizer *in_stack_ffffffffffffff98;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_ffffffffffffff30->tokenString_,(char *)in_stack_ffffffffffffff28,
             (allocator<char> *)in_stack_ffffffffffffff20);
  StringTokenizer::StringTokenizer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  iVar1 = StringTokenizer::countTokens(in_RDX);
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,"OptionSectionParser Error: Not enough tokens at line %d\n",
             (ulong)in_ECX);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
    ForceFieldOptions::setData
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)CONCAT44(iVar1,in_stack_fffffffffffffef0));
  return;
}

Assistant:

void OptionSectionParser::parseLine(ForceField&, const std::string& line,
                                      int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string optionName  = tokenizer.nextToken();
      std::string optionValue = tokenizer.nextToken();

      options_.setData(optionName, optionValue);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OptionSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }